

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  Status SVar1;
  char *in_RCX;
  string_view text;
  string sStack_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  SVar1 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  if (SVar1.Kind_ == Success) {
    if (((this->Moc).super_GenVarsT.Enabled != false) ||
       (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
      SetupWriteAutogenInfo(this);
    }
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      SetupWriteRccInfo(this);
    }
  }
  else {
    local_48.View_._M_len = 0x25;
    local_48.View_._M_str = "AutoGen: Could not create directory: ";
    text._M_str = in_RCX;
    text._M_len = (size_t)(this->Dir).Info._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_98,(cmQtAutoGen *)(this->Dir).Info._M_string_length,text);
    local_78.View_._M_len = local_98._M_string_length;
    local_78.View_._M_str = local_98._M_dataplus._M_p;
    cmStrCat<>(&sStack_b8,&local_48,&local_78);
    cmSystemTools::Error(&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return SVar1.Kind_ == Success;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    cmSystemTools::Error(cmStrCat("AutoGen: Could not create directory: ",
                                  Quoted(this->Dir.Info)));
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}